

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O2

JavascriptBigInt * Js::JavascriptBigInt::New(JavascriptBigInt *pbi,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  JavascriptBigInt *this;
  unsigned_long *ptr;
  size_t sizeInBytes;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (pbi->m_maxLength < pbi->m_length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x26,"(pbi->m_maxLength >= pbi->m_length)",
                                "pbi->m_maxLength >= pbi->m_length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_58 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_80f2896;
  data.filename._0_4_ = 0x27;
  pRVar4 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
  this = (JavascriptBigInt *)new<Memory::Recycler>(0x30,pRVar4,0x37a1d4);
  JavascriptBigInt(this,(((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                        bigintTypeStatic).ptr);
  data.plusSize = pbi->m_maxLength;
  this->m_length = pbi->m_length;
  this->m_maxLength = data.plusSize;
  this->m_isNegative = pbi->m_isNegative;
  local_58 = (undefined1  [8])&unsigned_long::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_80f2896;
  data.filename._0_4_ = 0x2b;
  pRVar4 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
  ptr = Memory::AllocateArray<Memory::Recycler,unsigned_long,false>
                  ((Memory *)pRVar4,(Recycler *)Memory::Recycler::AllocLeaf,0,pbi->m_maxLength);
  Memory::WriteBarrierPtr<unsigned_long>::WriteBarrierSet(&this->m_digits,ptr);
  sizeInBytes = this->m_length << 3;
  js_memcpy_s((this->m_digits).ptr,sizeInBytes,(pbi->m_digits).ptr,sizeInBytes);
  return this;
}

Assistant:

JavascriptBigInt * JavascriptBigInt::New(JavascriptBigInt * pbi, ScriptContext * scriptContext)
    {
        Assert(pbi->m_maxLength >= pbi->m_length);
        JavascriptBigInt * bigintNew = RecyclerNew(scriptContext->GetRecycler(), JavascriptBigInt, scriptContext->GetLibrary()->GetBigIntTypeStatic());
        bigintNew->m_length = pbi->m_length;
        bigintNew->m_maxLength = pbi->m_maxLength;
        bigintNew->m_isNegative = pbi->m_isNegative;
        bigintNew->m_digits = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), digit_t, pbi->m_maxLength);
        js_memcpy_s(bigintNew->m_digits, bigintNew->m_length * sizeof(digit_t), pbi->m_digits, bigintNew->m_length * sizeof(digit_t));
 
        return bigintNew;
    }